

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O0

callback<int_()> __thiscall
cppcms::plugin::manager::entry<int()>(manager *this,string *plugin_name,string *entry_name)

{
  bool bVar1;
  string *psVar2;
  undefined8 uVar3;
  refcounted *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_RDX;
  callable<int_()> *in_RDI;
  pointer_type ptr;
  callable_type *real_call;
  refcounted_ptr call;
  entry_point_type plugin_call;
  callback_type *result;
  string *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  callable<int_()> *in_stack_fffffffffffffd78;
  pointer_type __lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  string local_230 [192];
  string local_170 [32];
  intrusive_ptr<booster::callable<int_()>_> *local_150;
  undefined1 local_141;
  intrusive_ptr<booster::refcounted> local_c0 [11];
  undefined1 local_b5;
  code *local_28;
  string *local_18;
  
  __lhs_00.p_ = in_RDI;
  local_18 = in_RDX;
  psVar2 = (string *)cppcms::plugin::manager::instance();
  local_28 = (code *)cppcms::plugin::manager::get_entry(psVar2,local_18);
  if (local_28 == (code *)0x0) {
    local_b5 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                   in_stack_fffffffffffffdb0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
    cppcms_error::cppcms_error((cppcms_error *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    local_b5 = 0;
    __cxa_throw(uVar3,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  (*local_28)(local_c0);
  bVar1 = booster::intrusive_ptr<booster::refcounted>::operator!(local_c0);
  if (bVar1) {
    local_141 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                   in_stack_fffffffffffffdb0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
    cppcms_error::cppcms_error((cppcms_error *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    local_141 = 0;
    __cxa_throw(uVar3,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  prVar4 = booster::intrusive_ptr<booster::refcounted>::get(local_c0);
  if (prVar4 == (refcounted *)0x0) {
    local_150 = (intrusive_ptr<booster::callable<int_()>_> *)0x0;
  }
  else {
    local_150 = (intrusive_ptr<booster::callable<int_()>_> *)
                __dynamic_cast(prVar4,&booster::refcounted::typeinfo,
                               &booster::callable<int()>::typeinfo,0);
  }
  if (local_150 != (intrusive_ptr<booster::callable<int_()>_> *)0x0) {
    booster::intrusive_ptr<booster::callable<int_()>_>::intrusive_ptr
              (local_150,in_stack_fffffffffffffd78,SUB81((ulong)in_stack_fffffffffffffd70 >> 0x38,0)
              );
    booster::intrusive_ptr<booster::callable<int_()>_>::intrusive_ptr
              ((intrusive_ptr<booster::callable<int_()>_> *)in_stack_fffffffffffffd70,
               (intrusive_ptr<booster::callable<int_()>_> *)in_stack_fffffffffffffd68);
    booster::callback<int()>::callback<booster::callable<int()>>
              ((callback<int_()> *)in_stack_fffffffffffffd70,
               (intrusive_ptr<booster::callable<int_()>_> *)in_stack_fffffffffffffd68);
    booster::intrusive_ptr<booster::callable<int_()>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<int_()>_> *)in_stack_fffffffffffffd70);
    booster::intrusive_ptr<booster::callable<int_()>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<int_()>_> *)in_stack_fffffffffffffd70);
    booster::intrusive_ptr<booster::refcounted>::~intrusive_ptr
              ((intrusive_ptr<booster::refcounted> *)in_stack_fffffffffffffd70);
    return (callback<int_()>)(pointer_type)__lhs_00.p_;
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x48);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                 in_stack_fffffffffffffdb0);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffd70);
  std::operator+(__lhs,in_stack_fffffffffffffd70);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffd70);
  psVar2 = (string *)cppcms::plugin::manager::instance();
  cppcms::plugin::manager::signature(local_230,psVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs_00.p_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(__lhs,(char *)psVar2);
  cppcms::plugin::signature_error::signature_error((signature_error *)__lhs,local_170);
  __cxa_throw(__lhs,&signature_error::typeinfo,cppcms::plugin::signature_error::~signature_error);
}

Assistant:

booster::callback<Signature>
	entry(std::string const &plugin_name,std::string const &entry_name)
	{
		typedef booster::callback<Signature> callback_type;
		typedef typename callback_type::callable_type callable_type;
		typedef typename callback_type::pointer_type pointer_type;

		entry_point_type plugin_call = instance().get_entry(plugin_name,entry_name);
		if(!plugin_call)
			throw cppcms_error("Could not find entry `" + entry_name + "' in plugin `" + plugin_name + "'");
		refcounted_ptr call = plugin_call();
		if(!call)
			throw cppcms_error("Failed to create callback from plugin `"+plugin_name+"':entry `" + entry_name + "'");

		callable_type *real_call = dynamic_cast<callable_type *>(call.get());
		if(!real_call) {
			throw signature_error("Invalid signature request in plugin `"+ plugin_name +"':entry `"+entry_name+"', expected following signaure `" + instance().signature(plugin_name,entry_name) + "'");
		}
		pointer_type ptr(real_call);
		callback_type result(ptr);
		return result;
	}